

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

bool __thiscall
SQCompilation::FunctionReturnTypeEvaluator::checkReturn
          (FunctionReturnTypeEvaluator *this,ReturnStatement *ret)

{
  Expr *pEVar1;
  TerminateStatement *in_RSI;
  long in_RDI;
  FunctionReturnTypeEvaluator *unaff_retaddr;
  Expr *arg;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  pEVar1 = TerminateStatement::argument(in_RSI);
  if (pEVar1 == (Expr *)0x0) {
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 1;
  }
  else {
    checkExpr(unaff_retaddr,(Expr *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  }
  return true;
}

Assistant:

bool FunctionReturnTypeEvaluator::checkReturn(const ReturnStatement *ret) {

  const Expr *arg = ret->argument();

  if (arg == nullptr) {
    flags |= RT_NOTHING;
    return true;
  }

  checkExpr(arg);

  return true;
}